

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O2

char * tcmalloc::GetProgramInvocationName(void)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  char *__buf;
  ssize_t sVar4;
  char *retval;
  int sz;
  ulong __size;
  
  if ((GetProgramInvocationName()::argv0 == '\0') &&
     (iVar2 = __cxa_guard_acquire(&GetProgramInvocationName()::argv0), iVar2 != 0)) {
    __size = 0x400;
    __buf = (char *)0x0;
    do {
      if (0x3ffffffe < (uint)__size) {
LAB_0010ebcb:
        free(__buf);
        __buf = (char *)0x0;
        goto LAB_0010ebd5;
      }
      uVar1 = (uint)__size * 2;
      __size = (ulong)uVar1;
      __buf = (char *)realloc(__buf,__size);
      sVar4 = readlink("/proc/self/exe",__buf,__size);
      uVar3 = (uint)sVar4;
      if ((int)uVar3 < 0) {
        perror("GetProgramInvocationName:readlink");
        goto LAB_0010ebcb;
      }
    } while (uVar1 <= uVar3);
    __buf[uVar3 & 0x7fffffff] = '\0';
LAB_0010ebd5:
    GetProgramInvocationName::argv0 = __buf;
    __cxa_guard_release(&GetProgramInvocationName()::argv0);
  }
  return GetProgramInvocationName::argv0;
}

Assistant:

const char* GetProgramInvocationName() {
#if defined(__linux__) || defined(__NetBSD__)
  // Those systems have functional procfs. And we can simply readlink
  // /proc/self/exe.
  static const char* argv0 = readlink_strdup("/proc/self/exe");
  return argv0;
#elif defined(__sun__)
  static const char* argv0 = readlink_strdup("/proc/self/path/a.out");
  return argv0;
#elif defined(HAVE_PROGRAM_INVOCATION_NAME)
  extern char* program_invocation_name;  // gcc provides this
  return program_invocation_name;
#elif defined(__MACH__)
  // We don't want to allocate memory for this since we may be
  // calculating it when memory is corrupted.
  static char program_invocation_name[PATH_MAX];
  if (program_invocation_name[0] == '\0') {  // first time calculating
    uint32_t length = sizeof(program_invocation_name);
    if (_NSGetExecutablePath(program_invocation_name, &length))
      return nullptr;
  }
  return program_invocation_name;
#elif defined(__FreeBSD__)
  static char program_invocation_name[PATH_MAX];
  size_t len = sizeof(program_invocation_name);
  static const int name[4] = { CTL_KERN, KERN_PROC, KERN_PROC_PATHNAME, -1 };
  if (!sysctl(name, 4, program_invocation_name, &len, nullptr, 0))
    return program_invocation_name;
  return nullptr;
#else
  return nullptr; // figure out a way to get argv[0]
#endif
}